

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O1

void __thiscall QDBusPlatformMenuItem::QDBusPlatformMenuItem(QDBusPlatformMenuItem *this)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  int copy;
  QDBusPlatformMenuItem *local_28;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformMenuItem::QPlatformMenuItem((QPlatformMenuItem *)this);
  *(undefined ***)this = &PTR_metaObject_007f4cb8;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  QIcon::QIcon((QIcon *)(this + 0x30));
  *(undefined8 *)(this + 0x38) = 0;
  uVar1 = *(uint *)(this + 0x40);
  *(uint *)(this + 0x40) = uVar1 & 0xfffffc00 | 0x30;
  uVar2 = nextDBusID << 0x10;
  nextDBusID = nextDBusID + 1;
  *(uint *)(this + 0x40) = uVar1 & 0xfc00 | 0x30 | uVar2;
  QKeySequence::QKeySequence((QKeySequence *)(this + 0x48));
  local_1c = (int)*(short *)(this + 0x42);
  local_28 = (QDBusPlatformMenuItem *)this;
  QHash<int,QDBusPlatformMenuItem*>::emplace<QDBusPlatformMenuItem*const&>
            ((QHash<int,QDBusPlatformMenuItem*> *)&menuItemsByID,&local_1c,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDBusPlatformMenuItem::QDBusPlatformMenuItem()
    : m_subMenu(nullptr)
    , m_role(NoRole)
    , m_isEnabled(true)
    , m_isVisible(true)
    , m_isSeparator(false)
    , m_isCheckable(false)
    , m_isChecked(false)
    , m_hasExclusiveGroup(false)
    , m_dbusID(nextDBusID++)
{
    menuItemsByID.insert(m_dbusID, this);
}